

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddSharedFlags(cmLocalGenerator *this,string *flags,string *lang,bool shared)

{
  char *pcVar1;
  undefined1 local_48 [8];
  string flagsVar;
  bool shared_local;
  string *lang_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  flagsVar.field_2._M_local_buf[0xf] = shared;
  std::__cxx11::string::string((string *)local_48);
  if ((flagsVar.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::operator=((string *)local_48,"CMAKE_SHARED_LIBRARY_");
    std::__cxx11::string::operator+=((string *)local_48,(string *)lang);
    std::__cxx11::string::operator+=((string *)local_48,"_FLAGS");
    pcVar1 = cmMakefile::GetDefinition(this->Makefile,(string *)local_48);
    (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar1);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmLocalGenerator::AddSharedFlags(std::string& flags,
                                      const std::string& lang, bool shared)
{
  std::string flagsVar;

  // Add flags for dealing with shared libraries for this language.
  if (shared) {
    flagsVar = "CMAKE_SHARED_LIBRARY_";
    flagsVar += lang;
    flagsVar += "_FLAGS";
    this->AppendFlags(flags, this->Makefile->GetDefinition(flagsVar));
  }
}